

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O1

void highs::parallel::for_each<HEkkDual::majorUpdatePrimal()::__1&>
               (HighsInt start,HighsInt end,anon_class_40_5_b11b0fa6 *f,HighsInt grainSize)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  uint uVar3;
  uint32_t uVar4;
  element_type *peVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  pointer pdVar10;
  HighsSplitDeque *pHVar11;
  long *plVar12;
  ulong uVar13;
  int start_00;
  long lVar14;
  double dVar15;
  TaskGroup tg;
  TaskGroup local_40;
  
  if (grainSize < end - start) {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar12 = (long *)__tls_get_addr(&PTR_00449ef0);
    local_40.workerDeque = (HighsSplitDeque *)*plVar12;
    local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
    do {
      pHVar11 = local_40.workerDeque;
      start_00 = start + end >> 1;
      uVar3 = ((local_40.workerDeque)->ownerData).head;
      uVar13 = (ulong)uVar3;
      if (uVar13 < 0x2000) {
        ((local_40.workerDeque)->ownerData).head = uVar3 + 1;
        ((local_40.workerDeque)->taskArray)._M_elems[uVar13].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar13].taskData =
             &PTR_operator___004495e0;
        *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar13].taskData + 8) = start_00;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar13].taskData + 0xc) = end;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar13].taskData + 0x10) =
             grainSize;
        *(anon_class_40_5_b11b0fa6 **)
         (((local_40.workerDeque)->taskArray)._M_elems[uVar13].taskData + 0x18) = f;
        if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
          uVar4 = ((local_40.workerDeque)->ownerData).head;
          ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               CONCAT44(uVar4 - 1,uVar4);
          ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_40.workerDeque)->ownerData).splitCopy = ((local_40.workerDeque)->ownerData).head;
          ((local_40.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar5 = ((local_40.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var2._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
          (peVar5->haveJobs).super___atomic_base<int>._M_i =
               (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var2._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_40.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_40.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
      }
      else {
        if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
        puVar1 = &(pHVar11->ownerData).head;
        *puVar1 = *puVar1 + 1;
        for_each<HEkkDual::majorUpdatePrimal()::__1&>(start_00,end,f,grainSize);
      }
      end = start_00;
    } while (grainSize < start_00 - start);
    if (start < start_00) {
      pdVar6 = *f->colArray;
      pdVar7 = f->new_pivotal_edge_weight;
      pdVar8 = f->Kai;
      pdVar9 = *f->dseArray;
      pdVar10 = (f->edge_weight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar14 = (long)start;
      do {
        dVar15 = (*pdVar7 * pdVar6[lVar14] + *pdVar8 * pdVar9[lVar14]) * pdVar6[lVar14] +
                 pdVar10[lVar14];
        if (dVar15 <= 0.0001) {
          dVar15 = 0.0001;
        }
        pdVar10[lVar14] = dVar15;
        lVar14 = lVar14 + 1;
      } while (start_00 != lVar14);
    }
    TaskGroup::taskWait(&local_40);
    TaskGroup::~TaskGroup(&local_40);
  }
  else if (start < end) {
    pdVar6 = *f->colArray;
    pdVar7 = f->new_pivotal_edge_weight;
    pdVar8 = f->Kai;
    pdVar9 = *f->dseArray;
    pdVar10 = (f->edge_weight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar14 = (long)start;
    do {
      dVar15 = (*pdVar7 * pdVar6[lVar14] + *pdVar8 * pdVar9[lVar14]) * pdVar6[lVar14] +
               pdVar10[lVar14];
      if (dVar15 <= 0.0001) {
        dVar15 = 0.0001;
      }
      pdVar10[lVar14] = dVar15;
      lVar14 = lVar14 + 1;
    } while (end != lVar14);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}